

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  allocator local_16f9;
  string local_16f8;
  byte local_16d1;
  undefined1 local_16d0 [7];
  bool ret;
  string err;
  string warn;
  undefined1 local_1680 [8];
  Stage stage;
  char **argv_local;
  int argc_local;
  
  stage._prim_id_allocator._32_8_ = argv;
  tinyusdz::Stage::Stage((Stage *)local_1680);
  SimpleScene((Stage *)local_1680);
  std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_16d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16f8,"output.usda",&local_16f9);
  bVar1 = tinyusdz::usda::SaveAsUSDA
                    (&local_16f8,(Stage *)local_1680,(string *)((long)&err.field_2 + 8),
                     (string *)local_16d0);
  std::__cxx11::string::~string((string *)&local_16f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
  local_16d1 = bVar1;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"WARN: ");
    poVar4 = std::operator<<(poVar4,(string *)(err.field_2._M_local_buf + 8));
    std::operator<<(poVar4,"\n");
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"ERR: ");
    poVar4 = std::operator<<(poVar4,(string *)local_16d0);
    std::operator<<(poVar4,"\n");
  }
  iVar2 = -1;
  if ((local_16d1 & 1) != 0) {
    iVar2 = 0;
  }
  std::__cxx11::string::~string((string *)local_16d0);
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  tinyusdz::Stage::~Stage((Stage *)local_1680);
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
  tinyusdz::Stage stage; // empty scene

  SimpleScene(&stage);

  std::string warn;
  std::string err;
  bool ret = tinyusdz::usda::SaveAsUSDA("output.usda", stage, &warn, &err);

  if (warn.size()) {
    std::cout << "WARN: " << warn << "\n";
  }

  if (err.size()) {
    std::cerr << "ERR: " << err << "\n";
  }

  return ret ? EXIT_SUCCESS : -1;
}